

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O0

uint __thiscall QHexView::calcAddressWidth(QHexView *this)

{
  quint64 qVar1;
  uint uVar2;
  qint64 qVar3;
  ulong uVar4;
  qsizetype qVar5;
  QString local_38;
  ulong local_20;
  quint64 maxaddr;
  QHexView *this_local;
  
  if (this->m_hexdocument == (QHexDocument *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    qVar1 = (this->m_options).baseaddress;
    maxaddr = (quint64)this;
    qVar3 = QHexDocument::length(this->m_hexdocument);
    uVar4 = qVar1 + qVar3;
    local_20 = uVar4;
    uVar2 = std::numeric_limits<unsigned_int>::max();
    if (uVar2 < uVar4) {
      QString::number((ulonglong)&local_38,(int)local_20);
      qVar5 = QString::size(&local_38);
      this_local._4_4_ = (uint)qVar5;
      QString::~QString(&local_38);
    }
    else {
      this_local._4_4_ = 8;
    }
  }
  return this_local._4_4_;
}

Assistant:

unsigned int QHexView::calcAddressWidth() const {
    if(!m_hexdocument)
        return 0;

    auto maxaddr =
        static_cast<quint64>(m_options.baseaddress + m_hexdocument->length());
    if(maxaddr <= std::numeric_limits<quint32>::max())
        return 8;
    return QString::number(maxaddr, 16).size();
}